

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# onesided.c
# Opt level: O2

void gai_FindOffset(Integer ndim,Integer *lo,Integer *plo,Integer *ld,Integer *offset)

{
  Integer IVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  
  *offset = 0;
  lVar2 = 0;
  IVar1 = ndim;
  if (ndim < 1) {
    IVar1 = lVar2;
  }
  lVar3 = 1;
  for (lVar4 = 0; IVar1 != lVar4; lVar4 = lVar4 + 1) {
    lVar2 = lVar2 + (plo[lVar4] - lo[lVar4]) * lVar3;
    *offset = lVar2;
    if (lVar4 < ndim + -1) {
      lVar3 = lVar3 * ld[lVar4];
    }
  }
  return;
}

Assistant:

void  gai_FindOffset(Integer ndim,Integer *lo, Integer *plo,
    Integer *ld, Integer *offset)
{
  Integer i, factor;
  *offset = 0;
  factor = 1;
  for (i=0; i<ndim; i++) {
    *offset += (plo[i]-lo[i])*factor; 
    if (i<ndim-1) factor *= ld[i];
  }
}